

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  string *psVar1;
  char *ret;
  char *local_20;
  void *local_18 [2];
  
  local_20 = (char *)(this->elements_int & 0xfffffffffffffff8);
  local_18[0] = (void *)0x0;
  psVar1 = absl::lts_20240722::log_internal::Check_NEImpl<char*,decltype(nullptr)>
                     (&local_20,local_18,"ret != nullptr");
  if (psVar1 == (string *)0x0) {
    return local_20;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x98,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }